

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O3

bool GEO::String::to_bool(string *s)

{
  char cVar1;
  char *__s1;
  int iVar2;
  ConversionError *this;
  bool bVar3;
  string local_40;
  
  __s1 = (s->_M_dataplus)._M_p;
  iVar2 = strcmp(__s1,"true");
  bVar3 = true;
  if (iVar2 != 0) {
    iVar2 = strcmp(__s1,"True");
    if ((iVar2 != 0) && ((cVar1 = *__s1, cVar1 != '1' || (__s1[1] != '\0')))) {
      iVar2 = strcmp(__s1,"false");
      if (iVar2 != 0) {
        iVar2 = strcmp(__s1,"False");
        if ((iVar2 != 0) && ((cVar1 != '0' || (__s1[1] != '\0')))) {
          this = (ConversionError *)__cxa_allocate_exception(0x10);
          local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"boolean","");
          ConversionError::ConversionError(this,s,&local_40);
          __cxa_throw(this,&ConversionError::typeinfo,std::logic_error::~logic_error);
        }
      }
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

inline bool to_bool(const std::string& s) {
            bool value;
            if(!from_string(s, value)) {
                throw ConversionError(s, "boolean");
            }
            return value;
        }